

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<void_(int_*,_unsigned_long)>::FunctionMockerBase
          (FunctionMockerBase<void_(int_*,_unsigned_long)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<void_(int_*,_unsigned_long)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_003d3dc0;
  MockSpec<void_(int_*,_unsigned_long)>::MockSpec
            ((MockSpec<void_(int_*,_unsigned_long)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}